

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::Check(HeapInfo *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *in_R8;
  undefined8 *in_FS_OFFSET;
  size_t expectedHeapBlockCount;
  uint i_1;
  size_t currentLargeHeapBlockCount;
  long lStack_18;
  uint i;
  size_t currentSmallHeapBlockCount;
  HeapInfo *this_local;
  
  BVar3 = Recycler::CollectionInProgress(this->recycler);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x6c4,"(!this->recycler->CollectionInProgress())",
                       "!this->recycler->CollectionInProgress()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  lStack_18 = 0;
  for (currentLargeHeapBlockCount._4_4_ = 0; currentLargeHeapBlockCount._4_4_ < 0x30;
      currentLargeHeapBlockCount._4_4_ = currentLargeHeapBlockCount._4_4_ + 1) {
    sVar4 = HeapBucketGroup<SmallAllocationBlockAttributes>::Check
                      (this->heapBuckets + currentLargeHeapBlockCount._4_4_);
    sVar5 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetEmptyHeapBlockCount
                      (this->heapBuckets + currentLargeHeapBlockCount._4_4_);
    lStack_18 = sVar5 + sVar4 + lStack_18;
  }
  for (expectedHeapBlockCount._4_4_ = 0; expectedHeapBlockCount._4_4_ < 0x1d;
      expectedHeapBlockCount._4_4_ = expectedHeapBlockCount._4_4_ + 1) {
    sVar4 = HeapBucketGroup<MediumAllocationBlockAttributes>::Check
                      (this->mediumHeapBuckets + expectedHeapBlockCount._4_4_);
    sVar5 = HeapBucketGroup<MediumAllocationBlockAttributes>::GetEmptyHeapBlockCount
                      (this->mediumHeapBuckets + expectedHeapBlockCount._4_4_);
    lStack_18 = sVar5 + sVar4 + lStack_18;
  }
  sVar4 = Check<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,SUB81(this->newLeafHeapBlockList,0),
                     (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)in_R8);
  sVar5 = Check<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,SUB81(this->newNormalHeapBlockList,0),
                     (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)in_R8);
  sVar6 = Check<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,
                     SUB81(this->newNormalWithBarrierHeapBlockList,0),
                     (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)in_R8);
  sVar7 = Check<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,
                     SUB81(this->newFinalizableWithBarrierHeapBlockList,0),
                     (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)in_R8)
  ;
  sVar8 = Check<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,SUB81(this->newFinalizableHeapBlockList,0),
                     (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0,
                     (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)in_R8);
  sVar9 = Check<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
                    ((HeapInfo *)&DAT_00000001,false,SUB81(this->newMediumLeafHeapBlockList,0),
                     (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
                     (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)in_R8);
  sVar10 = Check<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                     ((HeapInfo *)&DAT_00000001,false,SUB81(this->newMediumNormalHeapBlockList,0),
                      (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
                      &in_R8->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>);
  sVar11 = Check<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                     ((HeapInfo *)&DAT_00000001,false,
                      SUB81(this->newMediumNormalWithBarrierHeapBlockList,0),
                      (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
                      (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)in_R8);
  sVar12 = Check<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                     ((HeapInfo *)&DAT_00000001,false,
                      SUB81(this->newMediumFinalizableWithBarrierHeapBlockList,0),
                      (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
                      (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                      in_R8);
  sVar13 = Check<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                     ((HeapInfo *)&DAT_00000001,false,
                      SUB81(this->newMediumFinalizableHeapBlockList,0),
                      (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0,in_R8);
  if (sVar13 + sVar12 + sVar11 + sVar10 + sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 + lStack_18
      != this->heapBlockCount[4] + this->heapBlockCount[5] + this->heapBlockCount[9] +
         this->heapBlockCount[10] +
         this->heapBlockCount[1] + this->heapBlockCount[2] + this->heapBlockCount[3] +
         this->heapBlockCount[6] + this->heapBlockCount[7] + this->heapBlockCount[8]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x707,"(currentSmallHeapBlockCount == expectedHeapBlockCount)",
                       "currentSmallHeapBlockCount == expectedHeapBlockCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  sVar4 = LargeHeapBucket::Check(&this->largeObjectBucket);
  if (sVar4 != this->heapBlockCount[0xb]) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x70b,
                       "(currentLargeHeapBlockCount == this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType])"
                       ,
                       "currentLargeHeapBlockCount == this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return;
}

Assistant:

void
HeapInfo::Check()
{
    Assert(!this->recycler->CollectionInProgress());

    size_t currentSmallHeapBlockCount = 0;
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        currentSmallHeapBlockCount += heapBuckets[i].Check();
        currentSmallHeapBlockCount += heapBuckets[i].GetEmptyHeapBlockCount();
    }

    size_t currentLargeHeapBlockCount = 0;
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
#if SMALLBLOCK_MEDIUM_ALLOC
        currentSmallHeapBlockCount += mediumHeapBuckets[i].Check();
        currentSmallHeapBlockCount += mediumHeapBuckets[i].GetEmptyHeapBlockCount();
#else
        currentLargeHeapBlockCount += mediumHeapBuckets[i].Check();
#endif
    }
#endif

#if ENABLE_CONCURRENT_GC
    currentSmallHeapBlockCount += Check(true, false, this->newLeafHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newNormalHeapBlockList);
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += Check(true, false, this->newNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newFinalizableWithBarrierHeapBlockList);
#endif
    currentSmallHeapBlockCount += Check(true, false, this->newFinalizableHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    currentSmallHeapBlockCount += Check(true, false, this->newRecyclerVisitedHostHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newMediumRecyclerVisitedHostHeapBlockList);
#endif
#endif

#if ENABLE_CONCURRENT_GC
    currentSmallHeapBlockCount += Check(true, false, this->newMediumLeafHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newMediumNormalHeapBlockList);
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += Check(true, false, this->newMediumNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += Check(true, false, this->newMediumFinalizableWithBarrierHeapBlockList);
#endif
    currentSmallHeapBlockCount += Check(true, false, this->newMediumFinalizableHeapBlockList);
#endif

    size_t expectedHeapBlockCount =
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockType]
#ifdef RECYCLER_VISITED_HOST
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType]
#endif
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockType];

#ifdef RECYCLER_WRITE_BARRIER
    expectedHeapBlockCount +=
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType];

#endif

    Assert(currentSmallHeapBlockCount == expectedHeapBlockCount);

    currentLargeHeapBlockCount += largeObjectBucket.Check();

    Assert(currentLargeHeapBlockCount == this->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]);
}